

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O1

void __thiscall
OpenMD::IcosahedralOfR::IcosahedralOfR
          (IcosahedralOfR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  long *local_38 [2];
  long local_28 [2];
  
  BOPofR::BOPofR(&this->super_BOPofR,info,filename,sele,rCut,nbins,len);
  (this->super_BOPofR).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__BOPofR_00339c78;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"Icosahedral Bond Order Parameter(r)","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_BOPofR).super_StaticAnalyser.analysisType_);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

IcosahedralOfR::IcosahedralOfR(SimInfo* info, const std::string& filename,
                                 const std::string& sele, double rCut,
                                 unsigned int nbins, RealType len) :
      BOPofR(info, filename, sele, rCut, nbins, len) {
    setAnalysisType("Icosahedral Bond Order Parameter(r)");
  }